

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonehash.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::ZoneHashBase::_rehash
          (ZoneHashBase *this,ZoneAllocator *allocator,uint32_t primeIndex)

{
  uint uVar1;
  uint uVar2;
  ZoneHashBase *pZVar3;
  void *pvVar4;
  uint in_EDX;
  ZoneHashBase *in_RDI;
  uint32_t hashMod;
  ZoneHashNode *next;
  ZoneHashNode *node;
  uint32_t oldCount;
  uint32_t i;
  ZoneHashNode **newData;
  ZoneHashNode **oldData;
  uint32_t newCount;
  char *in_stack_000003a0;
  int in_stack_000003ac;
  char *in_stack_000003b0;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined8 *in_stack_ffffffffffffffc0;
  ZoneAllocator *in_stack_ffffffffffffffc8;
  undefined8 *puVar5;
  uint local_2c;
  
  if (in_EDX < 0x81) {
    uVar1 = *(uint *)(ZoneHash_primeArray + (ulong)in_EDX * 8);
    pZVar3 = *(ZoneHashBase **)in_RDI;
    pvVar4 = ZoneAllocator::allocZeroed
                       ((ZoneAllocator *)
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(size_t)in_RDI
                       );
    if (pvVar4 != (void *)0x0) {
      uVar2 = *(uint *)(in_RDI + 0x10);
      *(void **)in_RDI = pvVar4;
      *(uint *)(in_RDI + 0x10) = uVar1;
      *(int *)(in_RDI + 0x14) = (int)(long)((double)uVar1 * 0.9);
      *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(ZoneHash_primeArray + (ulong)in_EDX * 8 + 4);
      in_RDI[0x1c] = *(ZoneHashBase *)(ZoneHash_primeShift + in_EDX);
      in_RDI[0x1d] = SUB41(in_EDX,0);
      for (local_2c = 0; local_2c < uVar2; local_2c = local_2c + 1) {
        puVar5 = *(undefined8 **)(pZVar3 + (ulong)local_2c * 8);
        while (puVar5 != (undefined8 *)0x0) {
          in_stack_ffffffffffffffc0 = (undefined8 *)*puVar5;
          in_stack_ffffffffffffffbc = _calcMod(in_RDI,*(uint32_t *)(puVar5 + 1));
          *puVar5 = *(undefined8 *)((long)pvVar4 + (ulong)in_stack_ffffffffffffffbc * 8);
          *(undefined8 **)((long)pvVar4 + (ulong)in_stack_ffffffffffffffbc * 8) = puVar5;
          puVar5 = in_stack_ffffffffffffffc0;
        }
        in_stack_ffffffffffffffc8 = (ZoneAllocator *)0x0;
      }
      if (pZVar3 != in_RDI + 0x20) {
        ZoneAllocator::release
                  (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
    }
    return;
  }
  DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
}

Assistant:

void ZoneHashBase::_rehash(ZoneAllocator* allocator, uint32_t primeIndex) noexcept {
  ASMJIT_ASSERT(primeIndex < ASMJIT_ARRAY_SIZE(ZoneHash_primeArray));
  uint32_t newCount = ZoneHash_primeArray[primeIndex].prime;

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    allocator->allocZeroed(size_t(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  _data = newData;
  _bucketsCount = newCount;
  _bucketsGrow = uint32_t(newCount * 0.9);
  _rcpValue = ZoneHash_primeArray[primeIndex].rcp;
  _rcpShift = ZoneHash_primeShift[primeIndex];
  _primeIndex = uint8_t(primeIndex);

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hashMod = _calcMod(node->_hashCode);

      node->_hashNext = newData[hashMod];
      newData[hashMod] = node;
      node = next;
    }
  }

  if (oldData != _embedded)
    allocator->release(oldData, oldCount * sizeof(ZoneHashNode*));
}